

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  ushort uVar1;
  ushort uVar2;
  BCReg BVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  uint uVar6;
  BCReg BVar7;
  int iVar8;
  uint uVar9;
  uint maxslot;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t local_138 [264];
  
  uVar6 = pc[1] >> 8 & 0xff;
  iVar8 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar8 = 0;
  }
  uVar9 = (int)pc + 8 + iVar8 * 4;
  pSVar4 = (J->cur).snap;
  uVar11 = (ulong)(J->cur).nsnap;
  uVar1 = pSVar4[uVar11 - 1].mapofs;
  uVar13 = (ulong)pSVar4[uVar11 - 1].nent;
  pSVar5 = (J->cur).snapmap;
  pSVar5[uVar1 + uVar13] = uVar9;
  J->needsnap = '\x01';
  maxslot = J->maxslot;
  if (uVar6 < J->maxslot) {
    J->maxslot = uVar6;
    uVar9 = pSVar5[uVar1 + uVar13];
    maxslot = uVar6;
  }
  BVar7 = snap_usedef(J,local_138,(BCIns *)(ulong)uVar9,maxslot);
  BVar3 = J->baseslot;
  pSVar4[uVar11 - 1].nslots = (uint8_t)(maxslot + BVar3);
  uVar6 = 0;
  for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    uVar9 = pSVar5[uVar1 + uVar10] >> 0x18;
    if ((uVar9 < BVar7 + BVar3) || ((uVar9 < maxslot + BVar3 && (local_138[uVar9 - BVar3] == '\0')))
       ) {
      uVar12 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      pSVar5[uVar1 + uVar12] = pSVar5[uVar1 + uVar10];
    }
  }
  pSVar4[uVar11 - 1].nent = (uint8_t)uVar6;
  uVar2 = (J->cur).nsnapmap;
  for (; (uint)uVar13 <= ~(uint)uVar1 + (uint)uVar2; uVar13 = (ulong)((uint)uVar13 + 1)) {
    uVar11 = (ulong)uVar6;
    uVar6 = uVar6 + 1;
    pSVar5[uVar1 + uVar11] = pSVar5[uVar1 + uVar13];
  }
  (J->cur).nsnapmap = uVar1 + (short)uVar6;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}